

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetActiveID(ImGuiID id,ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  
  pIVar1 = GImGui;
  GImGui->ActiveId = id;
  pIVar1->ActiveIdIsJustActivated = true;
  pIVar1->ActiveIdAllowOverlap = false;
  if (id != 0) {
    pIVar1->ActiveIdIsAlive = true;
  }
  pIVar1->ActiveIdWindow = window;
  return;
}

Assistant:

void ImGui::SetActiveID(ImGuiID id, ImGuiWindow* window = NULL)
{
    ImGuiContext& g = *GImGui;
    g.ActiveId = id;
    g.ActiveIdAllowOverlap = false;
    g.ActiveIdIsJustActivated = true;
    if (id)
        g.ActiveIdIsAlive = true;
    g.ActiveIdWindow = window;
}